

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O3

bool __thiscall ftxui::HorizontalContainer::EventHandler(HorizontalContainer *this,Event *event)

{
  int iVar1;
  size_t sVar2;
  int *piVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  int iVar6;
  int iVar7;
  Event EStack_68;
  
  iVar1 = *(this->super_ContainerBase).selector_;
  bVar5 = Event::operator==(event,(Event *)Event::ArrowLeft);
  if (bVar5) {
LAB_0013c209:
    ContainerBase::MoveSelector(&this->super_ContainerBase,-1);
  }
  else {
    Event::Character(&EStack_68,'h');
    _Var4._M_p = EStack_68.input_._M_dataplus._M_p;
    sVar2 = (event->input_)._M_string_length;
    if (sVar2 == EStack_68.input_._M_string_length) {
      if (sVar2 == 0) {
        bVar5 = true;
      }
      else {
        iVar6 = bcmp((event->input_)._M_dataplus._M_p,EStack_68.input_._M_dataplus._M_p,sVar2);
        bVar5 = iVar6 == 0;
      }
    }
    else {
      bVar5 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var4._M_p != &EStack_68.input_.field_2) {
      operator_delete(_Var4._M_p,EStack_68.input_.field_2._M_allocated_capacity + 1);
    }
    if (bVar5) goto LAB_0013c209;
  }
  bVar5 = Event::operator==(event,(Event *)Event::ArrowRight);
  if (!bVar5) {
    Event::Character(&EStack_68,'l');
    sVar2 = (event->input_)._M_string_length;
    if (sVar2 == EStack_68.input_._M_string_length) {
      if (sVar2 == 0) {
        bVar5 = true;
      }
      else {
        iVar6 = bcmp((event->input_)._M_dataplus._M_p,EStack_68.input_._M_dataplus._M_p,sVar2);
        bVar5 = iVar6 == 0;
      }
    }
    else {
      bVar5 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)EStack_68.input_._M_dataplus._M_p != &EStack_68.input_.field_2) {
      operator_delete(EStack_68.input_._M_dataplus._M_p,
                      EStack_68.input_.field_2._M_allocated_capacity + 1);
    }
    if (!bVar5) goto LAB_0013c29a;
  }
  ContainerBase::MoveSelector(&this->super_ContainerBase,1);
LAB_0013c29a:
  bVar5 = Event::operator==(event,(Event *)Event::Tab);
  if ((bVar5) &&
     ((this->super_ContainerBase).super_ComponentBase.children_.
      super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->super_ContainerBase).super_ComponentBase.children_.
      super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    ContainerBase::MoveSelectorWrap(&this->super_ContainerBase,1);
  }
  bVar5 = Event::operator==(event,(Event *)Event::TabReverse);
  if ((bVar5) &&
     ((this->super_ContainerBase).super_ComponentBase.children_.
      super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->super_ContainerBase).super_ComponentBase.children_.
      super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    ContainerBase::MoveSelectorWrap(&this->super_ContainerBase,-1);
  }
  piVar3 = (this->super_ContainerBase).selector_;
  iVar7 = (int)((ulong)((long)(this->super_ContainerBase).super_ComponentBase.children_.
                              super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->super_ContainerBase).super_ComponentBase.children_.
                             super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) + -1;
  iVar6 = *piVar3;
  if (iVar6 < iVar7) {
    iVar7 = iVar6;
  }
  iVar6 = 0;
  if (0 < iVar7) {
    iVar6 = iVar7;
  }
  *piVar3 = iVar6;
  return iVar1 != iVar6;
}

Assistant:

bool EventHandler(Event event) override {
    int old_selected = *selector_;
    if (event == Event::ArrowLeft || event == Event::Character('h'))
      MoveSelector(-1);
    if (event == Event::ArrowRight || event == Event::Character('l'))
      MoveSelector(+1);
    if (event == Event::Tab && children_.size())
      MoveSelectorWrap(+1);
    if (event == Event::TabReverse && children_.size())
      MoveSelectorWrap(-1);

    *selector_ = std::max(0, std::min(int(children_.size()) - 1, *selector_));
    return old_selected != *selector_;
  }